

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::calculateIntersections(ComplexToSimple *this)

{
  QRBTree<int> *this_00;
  long lVar1;
  Edge *pEVar2;
  Event *pEVar3;
  undefined8 uVar4;
  bool bVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *node;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar11;
  Node *local_b8;
  Intersection local_a8;
  QIntersectionPoint p;
  QPodPoint local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fillPriorityQueue(this);
  this_00 = &this->m_edgeList;
  do {
    lVar1 = (this->m_events).siz;
    if (lVar1 == 0) {
      QInt64Set::clear(&this->m_processedEdgePairs);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    pEVar3 = (this->m_events).buffer + lVar1 + -1;
    local_48 = pEVar3->point;
    uStack_40._0_4_ = pEVar3->type;
    uStack_40._4_4_ = pEVar3->edge;
    sortEdgeList(this,local_48);
    pVar11 = bounds(this,&local_48);
    pNVar7 = pVar11.first;
    if (pNVar7 == (Node *)0x0) {
      local_b8 = (Node *)0x0;
    }
    else {
      local_b8 = QRBTree<int>::previous(this_00,pNVar7);
    }
    pEVar2 = (this->m_edges).buffer;
    node = (Node *)(pEVar2 + uStack_40._4_4_);
    p.xOffset.numerator = 0;
    p.yOffset.numerator = 0;
    p.upperLeft = local_48;
    p.xOffset.denominator = 1;
    p.yOffset.denominator = 1;
    if (pNVar7 != (Node *)0x0) {
      splitEdgeListRange(this,pNVar7,pVar11.second,
                         *(int *)((long)&node->parent +
                                 (ulong)(byte)((int)uStack_40 == 0 ^
                                               pEVar2[uStack_40._4_4_].pointingUp ^ 1) * 4),&p);
      reorderEdgeListRange(this,pNVar7,pVar11.second);
      node = pNVar7;
    }
LAB_003e77fd:
    while (lVar1 = (this->m_events).siz, lVar1 != 0) {
      pEVar3 = (this->m_events).buffer;
      iVar9 = -(uint)(local_48.x == pEVar3[lVar1 + -1].point.x);
      iVar10 = -(uint)(local_48.y == pEVar3[lVar1 + -1].point.y);
      auVar8._4_4_ = iVar9;
      auVar8._0_4_ = iVar9;
      auVar8._8_4_ = iVar10;
      auVar8._12_4_ = iVar10;
      iVar9 = movmskpd((int)node,auVar8);
      if (iVar9 != 3) break;
      local_48 = pEVar3[lVar1 + -1].point;
      uVar4._0_4_ = pEVar3[lVar1 + -1].type;
      uVar4._4_4_ = pEVar3[lVar1 + -1].edge;
      (this->m_events).siz = lVar1 + -1;
      pNVar7 = (this->m_edges).buffer[(int)uVar4._4_4_].node;
      uStack_40 = uVar4;
      if (pNVar7 == (Node *)0x0) goto LAB_003e78ab;
      pNVar6 = QRBTree<int>::previous(this_00,pNVar7);
      pNVar7 = QRBTree<int>::next(this_00,(this->m_edges).buffer[(int)uVar4._4_4_].node);
      node = (Node *)((this->m_edges).buffer + (int)uVar4._4_4_);
      QRBTree<int>::deleteNode(this_00,(Node **)node);
      if ((pNVar6 != (Node *)0x0) && (pNVar7 != (Node *)0x0)) {
        uVar4._4_4_ = pNVar6->data;
        goto LAB_003e790a;
      }
    }
    while (((this->m_topIntersection).m_data.siz != 0 &&
           (bVar5 = QIntersectionPoint::operator<=
                              (&((this->m_topIntersection).m_data.buffer)->intersectionPoint,&p),
           bVar5))) {
      QMaxHeap<QTriangulator<unsigned_short>::ComplexToSimple::Intersection>::pop
                (&local_a8,&this->m_topIntersection);
    }
  } while( true );
LAB_003e78ab:
  pNVar6 = searchEdgeLeftOf(this,uVar4._4_4_,local_b8);
  pNVar7 = QRBTree<int>::newNode(this_00);
  (this->m_edges).buffer[(int)uVar4._4_4_].node = pNVar7;
  QRBTree<int>::attachAfter(this_00,pNVar6,pNVar7);
  node = (this->m_edges).buffer[(int)uVar4._4_4_].node;
  node->data = uVar4._4_4_;
  pNVar7 = QRBTree<int>::next(this_00,node);
  if (pNVar6 != (Node *)0x0) {
    node = (Node *)(ulong)(uint)pNVar6->data;
    calculateIntersection(this,pNVar6->data,uVar4._4_4_);
  }
  if (pNVar7 != (Node *)0x0) {
LAB_003e790a:
    node = (Node *)(ulong)uVar4._4_4_;
    calculateIntersection(this,uVar4._4_4_,pNVar7->data);
  }
  goto LAB_003e77fd;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::calculateIntersections()
{
    fillPriorityQueue();

    Q_ASSERT(m_topIntersection.empty());
    Q_ASSERT(m_edgeList.root == nullptr);

    // Find all intersection points.
    while (!m_events.isEmpty()) {
        Event event = m_events.last();
        sortEdgeList(event.point);

        // Find all edges in the edge list that contain the current vertex and mark them to be split later.
        std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> range = bounds(event.point);
        QRBTree<int>::Node *leftNode = range.first ? m_edgeList.previous(range.first) : nullptr;
        int vertex = (event.type == Event::Upper ? m_edges.at(event.edge).upper() : m_edges.at(event.edge).lower());
        QIntersectionPoint eventPoint = QT_PREPEND_NAMESPACE(qIntersectionPoint)(event.point);

        if (range.first != nullptr) {
            splitEdgeListRange(range.first, range.second, vertex, eventPoint);
            reorderEdgeListRange(range.first, range.second);
        }

        // Handle the edges with start or end point in the current vertex.
        while (!m_events.isEmpty() && m_events.last().point == event.point) {
            event = m_events.last();
            m_events.pop_back();
            int i = event.edge;

            if (m_edges.at(i).node) {
                // Remove edge from edge list.
                Q_ASSERT(event.type == Event::Lower);
                QRBTree<int>::Node *left = m_edgeList.previous(m_edges.at(i).node);
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                m_edgeList.deleteNode(m_edges.at(i).node);
                if (!left || !right)
                    continue;
                calculateIntersection(left->data, right->data);
            } else {
                // Insert edge into edge list.
                Q_ASSERT(event.type == Event::Upper);
                QRBTree<int>::Node *left = searchEdgeLeftOf(i, leftNode);
                m_edgeList.attachAfter(left, m_edges.at(i).node = m_edgeList.newNode());
                m_edges.at(i).node->data = i;
                QRBTree<int>::Node *right = m_edgeList.next(m_edges.at(i).node);
                if (left)
                    calculateIntersection(left->data, i);
                if (right)
                    calculateIntersection(i, right->data);
            }
        }
        while (!m_topIntersection.isEmpty() && m_topIntersection.top().intersectionPoint <= eventPoint)
            m_topIntersection.pop();
#ifdef Q_TRIANGULATOR_DEBUG
        DebugDialog dialog(this, vertex);
        dialog.exec();
#endif
    }
    m_processedEdgePairs.clear();
}